

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  ulong uVar1;
  uint _c;
  int *piVar2;
  size_t sVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [14];
  undefined1 auVar31 [14];
  undefined1 auVar32 [14];
  undefined1 auVar33 [14];
  undefined1 auVar34 [14];
  undefined1 auVar35 [14];
  undefined1 auVar36 [14];
  undefined1 auVar37 [14];
  undefined1 auVar38 [14];
  undefined1 auVar39 [14];
  undefined1 auVar40 [14];
  undefined1 auVar41 [14];
  undefined1 auVar42 [14];
  undefined1 auVar43 [14];
  undefined1 auVar44 [14];
  undefined1 auVar45 [14];
  undefined1 auVar46 [14];
  undefined1 auVar47 [14];
  undefined1 auVar48 [14];
  undefined1 auVar49 [14];
  undefined1 auVar50 [14];
  undefined1 auVar51 [14];
  undefined1 auVar52 [14];
  undefined1 auVar53 [14];
  undefined1 auVar54 [14];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [14];
  undefined1 auVar59 [14];
  undefined1 auVar60 [14];
  undefined1 auVar61 [14];
  undefined1 auVar62 [14];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [14];
  undefined1 auVar67 [14];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [14];
  undefined1 auVar72 [14];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined4 uVar76;
  undefined4 uVar77;
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined8 uVar81;
  undefined1 auVar82 [12];
  undefined1 auVar83 [14];
  undefined1 auVar84 [12];
  undefined1 auVar85 [14];
  undefined1 auVar86 [12];
  undefined1 auVar87 [14];
  undefined1 auVar88 [12];
  undefined1 auVar89 [14];
  undefined1 auVar90 [14];
  undefined1 auVar91 [14];
  undefined1 auVar92 [14];
  undefined1 auVar93 [14];
  undefined1 auVar94 [14];
  undefined1 auVar95 [14];
  undefined1 auVar96 [14];
  undefined1 auVar97 [14];
  undefined1 auVar98 [14];
  undefined1 auVar99 [14];
  undefined1 auVar100 [14];
  undefined1 auVar101 [14];
  undefined1 auVar102 [12];
  undefined1 auVar103 [14];
  undefined1 auVar104 [14];
  undefined1 auVar105 [14];
  undefined1 auVar106 [14];
  undefined1 auVar107 [14];
  undefined1 auVar108 [14];
  undefined1 auVar109 [14];
  undefined1 auVar110 [14];
  undefined1 auVar111 [14];
  undefined1 auVar112 [12];
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  undefined1 auVar115 [12];
  undefined6 uVar116;
  ulong uVar117;
  undefined4 *puVar118;
  long lVar119;
  short asVar120 [4];
  ulong uVar121;
  undefined8 *puVar122;
  undefined4 *puVar123;
  long lVar124;
  void *pvVar125;
  int iVar126;
  long lVar127;
  void *pvVar128;
  int iVar129;
  long lVar130;
  long lVar131;
  uint uVar132;
  void *pvVar133;
  ulong uVar134;
  ulong uVar135;
  int i;
  uint uVar136;
  uint uVar137;
  long lVar138;
  ulong uVar139;
  short asVar140 [4];
  long lVar141;
  undefined4 *puVar142;
  void *pvVar143;
  undefined4 *puVar144;
  void *pvVar145;
  long lVar146;
  uint uVar147;
  void *pvVar148;
  long lVar149;
  uint uVar150;
  ulong uVar151;
  int iVar152;
  int iVar153;
  int iVar166;
  int iVar167;
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  short sVar168;
  short sVar193;
  short sVar195;
  short sVar197;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  short sVar198;
  ushort uVar215;
  short sVar217;
  short sVar219;
  ushort uVar221;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  short sVar216;
  short sVar218;
  short sVar220;
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar214 [16];
  undefined4 uVar222;
  undefined1 in_XMM4 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar234 [16];
  undefined4 uVar238;
  short sVar249;
  short sVar251;
  uint uVar250;
  undefined1 in_XMM5 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  short sVar266;
  short sVar267;
  undefined1 auVar252 [12];
  undefined1 auVar253 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar268 [12];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar274 [12];
  undefined1 auVar275 [16];
  void *local_3b0;
  void *local_3a0;
  void *local_380;
  int tiles;
  int nRowBlocks;
  int nColBlocks;
  void *local_320;
  void *local_318;
  void *local_310;
  short d1 [4];
  int aiStack_2f0 [2];
  size_t local_2e8;
  int iStack_2e0;
  undefined4 uStack_2dc;
  Allocator *local_2d8;
  int iStack_2d0;
  int iStack_2cc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  undefined4 uStack_2bc;
  size_t local_2b8;
  ulong local_2b0;
  long local_2a8;
  size_t local_2a0;
  long local_298;
  undefined8 local_290;
  long local_288;
  short local_280 [4];
  ulong local_278;
  short local_270 [4];
  void *local_268;
  void *local_260;
  void *local_258;
  void *local_250;
  ulong local_248;
  uint local_23c;
  undefined1 local_238 [64];
  size_t local_1f8;
  short d0 [4];
  Mat local_198;
  Mat *local_150;
  ulong local_148;
  int local_13c;
  short d2 [4];
  int aiStack_130 [2];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  short d3 [4];
  int aiStack_f0 [2];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  int sum3 [16];
  Option opt_b;
  undefined1 auVar155 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined2 uVar165;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 uVar191;
  undefined1 uVar192;
  undefined1 uVar194;
  short sVar196;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar203 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  short sVar248;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar259 [16];
  undefined1 auVar256 [16];
  undefined1 auVar260 [16];
  short sVar272;
  short sVar273;
  undefined1 auVar276 [16];
  
  _c = bottom_blob->c;
  uVar136 = top_blob->w;
  local_248 = (ulong)uVar136;
  uVar150 = top_blob->h;
  local_278 = (ulong)uVar150;
  iVar129 = top_blob->c;
  uVar117 = (ulong)iVar129;
  local_198.data = bottom_blob->data;
  piVar2 = bottom_blob->refcount;
  local_198.refcount._0_4_ = SUB84(piVar2,0);
  local_198.refcount._4_4_ = (undefined4)((ulong)piVar2 >> 0x20);
  local_198.elemsize = bottom_blob->elemsize;
  local_198.elempack = bottom_blob->elempack;
  local_198.allocator = bottom_blob->allocator;
  uVar76 = bottom_blob->dims;
  uVar77 = bottom_blob->w;
  local_198.h = bottom_blob->h;
  local_198.d = bottom_blob->d;
  iVar152 = bottom_blob->w;
  iVar153 = bottom_blob->h;
  local_198.cstep = bottom_blob->cstep;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
    iVar152 = bottom_blob->w;
    iVar153 = bottom_blob->h;
  }
  uVar147 = (uVar136 - ((int)(uVar136 + 1) >> 0x1f)) + 1;
  uVar136 = uVar147 & 0xfffffffe;
  local_148 = (ulong)uVar136;
  uVar150 = (uVar150 - ((int)(uVar150 + 1) >> 0x1f)) + 1;
  local_23c = uVar150 & 0xfffffffe;
  iVar126 = uVar136 + 2;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.openmp_blocktime = opt->openmp_blocktime;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_packed = opt->use_int8_packed;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_subgroup_basic = opt->use_subgroup_basic;
  opt_b.use_subgroup_vote = opt->use_subgroup_vote;
  opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_b.use_image_storage = opt->use_image_storage;
  opt_b.use_tensor_storage = opt->use_tensor_storage;
  opt_b.use_reserved_0 = opt->use_reserved_0;
  auVar170._0_4_ = opt->flush_denormals;
  auVar170[4] = opt->use_local_pool_allocator;
  auVar170[5] = opt->use_shader_local_memory;
  auVar170[6] = opt->use_cooperative_matrix;
  auVar170[7] = opt->use_winograd23_convolution;
  auVar170[8] = opt->use_winograd43_convolution;
  auVar170[9] = opt->use_winograd63_convolution;
  auVar170[10] = opt->use_reserved_6;
  auVar170[0xb] = opt->use_reserved_7;
  auVar170[0xc] = opt->use_reserved_8;
  auVar170[0xd] = opt->use_reserved_9;
  auVar170[0xe] = opt->use_reserved_10;
  auVar170[0xf] = opt->use_reserved_11;
  opt_b.blob_allocator = opt->workspace_allocator;
  local_198.dims = uVar76;
  local_198.w = uVar77;
  local_198.c = _c;
  local_150 = top_blob;
  opt_b._48_16_ = auVar170;
  copy_make_border(bottom_blob,&local_198,0,(local_23c - iVar153) + 2,0,iVar126 - iVar152,0,0.0,
                   &opt_b);
  uVar147 = (int)uVar147 >> 1;
  uVar150 = (int)uVar150 >> 1;
  local_1f8 = 0;
  uVar136 = uVar150 * uVar147;
  local_238._0_8_ = (void *)0x0;
  local_238._8_4_ = 0;
  local_238._12_4_ = 0;
  local_238._16_8_ = (void *)0x0;
  local_238._24_4_ = 0;
  local_238._32_8_ = (Allocator *)0x0;
  local_238._40_4_ = 0;
  local_238._44_4_ = 0;
  local_238._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_238,0x10,uVar136,_c,2,opt->workspace_allocator);
  auVar244 = _DAT_00517c10;
  uVar134 = (ulong)_c;
  if (0 < (int)_c) {
    lVar130 = (long)iVar126;
    uVar132 = 1;
    if (1 < (int)uVar147) {
      uVar132 = uVar147;
    }
    uVar135 = 1;
    if (1 < (int)uVar150) {
      uVar135 = (ulong)uVar150;
    }
    uVar139 = 0;
    do {
      if (0 < (int)local_278) {
        pvVar148 = (void *)(local_1f8 * local_238._16_8_ * uVar139 + local_238._0_8_);
        uVar151 = 0;
        do {
          if (0 < (int)local_248) {
            puVar123 = (undefined4 *)
                       ((long)local_198.data +
                       (long)(iVar126 * 2 * (int)uVar151) +
                       local_198.cstep * local_198.elemsize * uVar139);
            puVar142 = (undefined4 *)((long)puVar123 + lVar130);
            puVar144 = (undefined4 *)((long)puVar142 + lVar130);
            puVar118 = (undefined4 *)(lVar130 + (long)puVar144);
            uVar137 = 0;
            do {
              auVar154 = _d3;
              uVar222 = *puVar123;
              auVar4[0xd] = 0;
              auVar4._0_13_ = auVar170._0_13_;
              auVar4[0xe] = auVar170[7];
              auVar27[0xc] = auVar170[6];
              auVar27._0_12_ = auVar170._0_12_;
              auVar27._13_2_ = auVar4._13_2_;
              auVar55[0xb] = 0;
              auVar55._0_11_ = auVar170._0_11_;
              auVar55._12_3_ = auVar27._12_3_;
              auVar63[10] = auVar170[5];
              auVar63._0_10_ = auVar170._0_10_;
              auVar63._11_4_ = auVar55._11_4_;
              auVar68[9] = 0;
              auVar68._0_9_ = auVar170._0_9_;
              auVar68._10_5_ = auVar63._10_5_;
              auVar73[8] = auVar170[4];
              auVar73._0_8_ = auVar170._0_8_;
              auVar73._9_6_ = auVar68._9_6_;
              auVar199._8_7_ = auVar73._8_7_;
              auVar199[7] = (char)((uint)uVar222 >> 0x18);
              auVar199[6] = auVar170[3];
              auVar199[5] = (char)((uint)uVar222 >> 0x10);
              auVar199[4] = auVar170[2];
              auVar199[3] = (char)((uint)uVar222 >> 8);
              auVar199[2] = auVar170[1];
              auVar199[0] = auVar170[0];
              auVar199[1] = (char)uVar222;
              auVar199[0xf] = 0;
              auVar200 = psraw(auVar199,8);
              uVar222 = *puVar142;
              auVar5[0xd] = 0;
              auVar5._0_13_ = in_XMM4._0_13_;
              auVar5[0xe] = in_XMM4[7];
              auVar28[0xc] = in_XMM4[6];
              auVar28._0_12_ = in_XMM4._0_12_;
              auVar28._13_2_ = auVar5._13_2_;
              auVar56[0xb] = 0;
              auVar56._0_11_ = in_XMM4._0_11_;
              auVar56._12_3_ = auVar28._12_3_;
              auVar64[10] = in_XMM4[5];
              auVar64._0_10_ = in_XMM4._0_10_;
              auVar64._11_4_ = auVar56._11_4_;
              auVar69[9] = 0;
              auVar69._0_9_ = in_XMM4._0_9_;
              auVar69._10_5_ = auVar64._10_5_;
              auVar74[8] = in_XMM4[4];
              auVar74._0_8_ = in_XMM4._0_8_;
              auVar74._9_6_ = auVar69._9_6_;
              auVar223._8_7_ = auVar74._8_7_;
              auVar223[7] = (char)((uint)uVar222 >> 0x18);
              auVar223[6] = in_XMM4[3];
              auVar223[5] = (char)((uint)uVar222 >> 0x10);
              auVar223[4] = in_XMM4[2];
              auVar223[3] = (char)((uint)uVar222 >> 8);
              auVar223[2] = in_XMM4[1];
              auVar223[0] = in_XMM4[0];
              auVar223[1] = (char)uVar222;
              auVar223[0xf] = 0;
              auVar224 = psraw(auVar223,8);
              uVar222 = *puVar144;
              auVar6[0xd] = 0;
              auVar6._0_13_ = in_XMM5._0_13_;
              auVar6[0xe] = in_XMM5[7];
              auVar29[0xc] = in_XMM5[6];
              auVar29._0_12_ = in_XMM5._0_12_;
              auVar29._13_2_ = auVar6._13_2_;
              auVar57[0xb] = 0;
              auVar57._0_11_ = in_XMM5._0_11_;
              auVar57._12_3_ = auVar29._12_3_;
              auVar65[10] = in_XMM5[5];
              auVar65._0_10_ = in_XMM5._0_10_;
              auVar65._11_4_ = auVar57._11_4_;
              auVar70[9] = 0;
              auVar70._0_9_ = in_XMM5._0_9_;
              auVar70._10_5_ = auVar65._10_5_;
              auVar75[8] = in_XMM5[4];
              auVar75._0_8_ = in_XMM5._0_8_;
              auVar75._9_6_ = auVar70._9_6_;
              auVar239._8_7_ = auVar75._8_7_;
              auVar239[7] = (char)((uint)uVar222 >> 0x18);
              auVar239[6] = in_XMM5[3];
              auVar239[5] = (char)((uint)uVar222 >> 0x10);
              auVar239[4] = in_XMM5[2];
              auVar239[3] = (char)((uint)uVar222 >> 8);
              auVar239[2] = in_XMM5[1];
              auVar239[0] = in_XMM5[0];
              auVar239[1] = (char)uVar222;
              auVar239[0xf] = 0;
              auVar240 = psraw(auVar239,8);
              uVar222 = *puVar118;
              uVar194 = (undefined1)((uint)uVar222 >> 0x18);
              uVar192 = (undefined1)((uint)uVar222 >> 0x10);
              uVar191 = (undefined1)((uint)uVar222 >> 8);
              auVar169._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar194,uVar194),uVar192),
                                  CONCAT14(uVar192,uVar222)) >> 0x20);
              auVar169[3] = uVar191;
              auVar169[2] = uVar191;
              auVar169[0] = (undefined1)uVar222;
              auVar169[1] = auVar169[0];
              auVar169._8_8_ = 0;
              auVar170 = psraw(auVar169,8);
              sVar196 = auVar240._0_2_;
              auVar204._0_2_ = auVar200._0_2_ - sVar196;
              sVar248 = auVar240._2_2_;
              uVar215 = auVar200._2_2_ - sVar248;
              sVar249 = auVar240._4_2_;
              sVar217 = auVar200._4_2_ - sVar249;
              sVar251 = auVar240._6_2_;
              sVar219 = auVar200._6_2_ - sVar251;
              uVar222 = CONCAT22(sVar219,sVar217);
              uVar221 = auVar200._10_2_ - auVar240._10_2_;
              sVar266 = auVar224._0_2_;
              auVar268._0_2_ = sVar266 + sVar196;
              sVar267 = auVar224._2_2_;
              auVar268._2_2_ = sVar267 + sVar248;
              sVar272 = auVar224._4_2_;
              auVar268._4_2_ = sVar272 + sVar249;
              sVar273 = auVar224._6_2_;
              auVar268._6_2_ = sVar273 + sVar251;
              auVar268._8_2_ = auVar224._8_2_ + auVar240._8_2_;
              auVar268._10_2_ = auVar224._10_2_ + auVar240._10_2_;
              sVar248 = sVar248 - sVar267;
              uVar238 = CONCAT22(sVar248,sVar196 - sVar266);
              sVar251 = sVar251 - sVar273;
              auVar171._0_2_ = auVar170._0_2_ - sVar266;
              auVar171._2_2_ = auVar170._2_2_ - sVar267;
              auVar171._4_2_ = auVar170._4_2_ - sVar272;
              auVar171._6_2_ = auVar170._6_2_ - sVar273;
              auVar171._8_2_ = auVar170._8_2_ - auVar224._8_2_;
              auVar171._10_2_ = auVar170._10_2_ - auVar224._10_2_;
              auVar171._12_2_ = auVar170._12_2_ - auVar224._12_2_;
              auVar171._14_2_ = auVar170._14_2_ - auVar224._14_2_;
              auVar274._2_2_ = 0;
              auVar274._0_2_ = uVar215;
              auVar274._4_2_ = sVar219;
              auVar274._6_2_ = 0;
              auVar274._8_4_ = (uint)(((ulong)uVar221 << 0x30) >> 0x30);
              auVar252._0_8_ = CONCAT44(uVar222,uVar222);
              auVar252._8_4_ = uVar222;
              uVar116 = CONCAT24(auVar268._6_2_,CONCAT22(sVar219,uVar221));
              auVar115._2_4_ = (int)((uint6)uVar116 >> 0x10);
              auVar115._0_2_ = auVar268._4_2_;
              auVar115._6_6_ = 0;
              auVar112._2_2_ = auVar268._2_2_;
              auVar112._0_2_ = sVar217;
              auVar112._4_8_ = SUB128(auVar115 << 0x30,4);
              auVar78._2_10_ = auVar112._2_10_;
              auVar78._0_2_ = uVar215;
              auVar201._0_8_ = auVar78._0_8_ << 0x20;
              auVar274 = auVar268 & SUB1612(ZEXT416(0xffff0000),0) | auVar274;
              auVar256._12_2_ = sVar219;
              auVar256._0_12_ = auVar252;
              auVar256._14_2_ = auVar268._6_2_;
              auVar255._12_4_ = auVar256._12_4_;
              auVar255._0_10_ = auVar252._0_10_;
              auVar255._10_2_ = auVar268._4_2_;
              auVar254._10_6_ = auVar255._10_6_;
              auVar254._8_2_ = sVar217;
              auVar254._0_8_ = auVar252._0_8_;
              auVar253._8_8_ = auVar254._8_8_;
              auVar253._6_2_ = auVar268._6_2_;
              auVar253._4_2_ = sVar219;
              auVar253._0_4_ = uVar222;
              auVar257._0_8_ = auVar253._4_8_ << 0x20;
              uVar222 = CONCAT22(auVar268._6_2_,sVar219);
              uVar250 = (uint)(CONCAT26(sVar251,CONCAT24(sVar249 - sVar272,uVar238)) >> 0x20);
              auVar201._8_4_ = auVar78._0_4_;
              auVar201._12_4_ = uVar250;
              auVar224._4_8_ = auVar201._8_8_;
              auVar224._0_4_ = uVar238;
              auVar224._12_4_ = 0;
              auVar200._4_4_ = uVar250 >> 0x10;
              auVar200._0_4_ = auVar274._4_4_;
              auVar200._8_8_ = 0;
              auVar257._8_4_ = auVar253._4_4_;
              auVar257._12_4_ = uVar250;
              auVar240._4_8_ = auVar257._8_8_;
              auVar240._0_4_ = uVar250;
              auVar240._12_4_ = 0;
              auVar203._0_12_ = SUB1612(auVar224 << 0x20,0);
              auVar203._12_2_ = sVar248;
              auVar203._14_2_ = auVar171._6_2_;
              auVar202._12_4_ = auVar203._12_4_;
              auVar202._0_10_ = SUB1610(auVar224 << 0x20,0);
              auVar202._10_2_ = auVar171._4_2_;
              auVar113._4_2_ = sVar196 - sVar266;
              auVar113._0_4_ = uVar238;
              auVar113._6_6_ = auVar202._10_6_;
              auVar79._4_8_ = auVar113._4_8_;
              auVar79._2_2_ = auVar171._2_2_;
              auVar79._0_2_ = auVar268._0_2_;
              auVar204._2_2_ = auVar171._0_2_;
              auVar204._8_4_ = auVar113._4_4_;
              auVar204._4_4_ = auVar202._12_4_;
              auVar204._12_4_ = auVar79._0_4_;
              auVar170 = pshufhw(auVar204,auVar204,0xe8);
              auVar205._0_4_ = auVar170._0_4_;
              auVar205._8_4_ = auVar170._8_4_;
              auVar205._12_4_ = auVar170._12_4_;
              auVar205._4_4_ = auVar205._8_4_;
              auVar224 = pshuflw(auVar205,auVar205,0x6c);
              auVar276._0_12_ = SUB1612(auVar200 << 0x40,0);
              auVar276._12_2_ = 0;
              auVar276._14_2_ = auVar171._6_2_;
              auVar275._12_4_ = auVar276._12_4_;
              auVar275._0_10_ = SUB1610(auVar200 << 0x40,0);
              auVar275._10_2_ = auVar171._4_2_;
              uVar81 = CONCAT62(auVar275._10_6_,sVar248);
              auVar80._4_8_ = uVar81;
              auVar80._2_2_ = auVar171._2_2_;
              auVar80._0_2_ = auVar274._2_2_;
              auVar241._14_2_ = auVar171._0_2_;
              auVar241._12_2_ = auVar274._0_2_;
              auVar241._4_4_ = auVar80._0_4_;
              auVar241._0_4_ = auVar275._12_4_;
              auVar241._8_4_ = (int)uVar81;
              auVar170 = pshufhw(auVar241,auVar241,0xe8);
              auVar242._4_4_ = auVar170._4_4_;
              auVar242._8_4_ = auVar170._8_4_;
              auVar242._12_4_ = auVar170._12_4_;
              auVar242._0_4_ = auVar242._8_4_;
              in_XMM5 = pshuflw(auVar242,auVar242,0xc9);
              auVar260._0_12_ = SUB1612(auVar240 << 0x20,0);
              auVar260._12_2_ = sVar251;
              auVar260._14_2_ = auVar171._6_2_;
              auVar259._12_4_ = auVar260._12_4_;
              auVar259._0_10_ = SUB1610(auVar240 << 0x20,0);
              auVar259._10_2_ = auVar171._4_2_;
              auVar114._4_2_ = sVar249 - sVar272;
              auVar114._0_4_ = uVar250;
              auVar114._6_6_ = auVar259._10_6_;
              auVar258._8_8_ = auVar114._4_8_;
              auVar258._6_2_ = auVar171._2_2_;
              auVar258._4_2_ = auVar268._4_2_;
              auVar258._2_2_ = auVar171._0_2_;
              auVar258._0_2_ = sVar217;
              auVar200 = pshuflw(auVar258,auVar258,0xe8);
              in_XMM4 = ZEXT616(CONCAT24(sVar251,uVar222)) & auVar244;
              auVar240 = ~auVar244 & auVar171 | in_XMM4;
              sVar249 = auVar200._0_2_;
              sVar198 = auVar224._0_2_ - sVar249;
              sVar251 = auVar200._2_2_;
              sVar216 = auVar224._2_2_ - sVar251;
              sVar266 = auVar200._8_2_;
              sVar218 = auVar224._4_2_ - sVar266;
              sVar267 = auVar200._10_2_;
              sVar220 = auVar224._6_2_ - sVar267;
              auVar170._8_2_ = auVar224._8_2_ - sVar266;
              auVar170._0_2_ = sVar198;
              auVar170._2_2_ = sVar216;
              auVar170._4_2_ = sVar218;
              auVar170._6_2_ = sVar220;
              auVar170._10_2_ = auVar224._10_2_ - sVar267;
              auVar170._12_2_ = auVar224._12_2_ - auVar200._12_2_;
              auVar170._14_2_ = auVar224._14_2_ - auVar200._14_2_;
              d0[0] = sVar198;
              d0[1] = sVar216;
              d0[2] = sVar218;
              d0[3] = sVar220;
              sVar217 = in_XMM5._0_2_;
              sVar168 = sVar217 + sVar249;
              sVar219 = in_XMM5._2_2_;
              sVar193 = sVar219 + sVar251;
              sVar196 = in_XMM5._4_2_;
              sVar195 = sVar196 + sVar266;
              sVar248 = in_XMM5._6_2_;
              sVar197 = sVar248 + sVar267;
              d1[0] = sVar168;
              d1[1] = sVar193;
              d1[2] = sVar195;
              d1[3] = sVar197;
              d2[1] = sVar251 - sVar219;
              d2[0] = sVar249 - sVar217;
              d2[2] = sVar266 - sVar196;
              d2[3] = sVar267 - sVar248;
              d3[1] = auVar240._2_2_ - sVar219;
              d3[0] = auVar240._0_2_ - sVar217;
              d3[2] = auVar240._4_2_ - sVar196;
              d3[3] = auVar240._6_2_ - sVar248;
              aiStack_f0 = auVar154._8_8_;
              lVar119 = 0;
              do {
                *(undefined2 *)((long)pvVar148 + lVar119) = *(undefined2 *)((long)d0 + lVar119);
                *(undefined2 *)((long)pvVar148 + lVar119 + 8) = *(undefined2 *)((long)d1 + lVar119);
                *(undefined2 *)((long)pvVar148 + lVar119 + 0x10) =
                     *(undefined2 *)((long)d2 + lVar119);
                *(undefined2 *)((long)pvVar148 + lVar119 + 0x18) =
                     *(undefined2 *)((long)d3 + lVar119);
                lVar119 = lVar119 + 2;
              } while (lVar119 != 8);
              puVar123 = (undefined4 *)((long)puVar123 + 2);
              puVar142 = (undefined4 *)((long)puVar142 + 2);
              puVar144 = (undefined4 *)((long)puVar144 + 2);
              puVar118 = (undefined4 *)((long)puVar118 + 2);
              pvVar148 = (void *)((long)pvVar148 + 0x20);
              uVar137 = uVar137 + 1;
            } while (uVar137 != uVar132);
          }
          uVar151 = uVar151 + 1;
        } while (uVar151 != uVar135);
      }
      uVar139 = uVar139 + 1;
    } while (uVar139 != uVar134);
  }
  piVar2 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize = 0;
  local_198.elempack = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  d0[0] = 0;
  d0[1] = 0;
  d0[2] = 0;
  d0[3] = 0;
  Mat::create((Mat *)d0,0x10,uVar136,iVar129,4,opt->workspace_allocator);
  asVar140._0_4_ = iVar129 >> 2;
  local_2b0 = uVar117 & 0xfffffffffffffffc;
  if (0 < (int)asVar140._0_4_) {
    local_380 = kernel_tm->data;
    local_2a0 = kernel_tm->elemsize;
    asVar140[2] = 0;
    asVar140[3] = 0;
    lVar130 = kernel_tm->cstep * local_2a0;
    local_288 = lVar130 * 4;
    local_2a8 = local_2a0 * 4;
    local_310 = (void *)((long)local_380 + lVar130);
    local_318 = (void *)((long)local_380 + lVar130 * 2);
    local_320 = (void *)(lVar130 * 3 + (long)local_380);
    local_298 = 0;
    local_290 = 0;
    asVar120[0] = 0;
    asVar120[1] = 0;
    asVar120[2] = 0;
    asVar120[3] = 0;
    do {
      local_270 = asVar120;
      if (0 < (int)uVar136) {
        iVar152 = kernel_tm->w;
        local_250 = (void *)local_238._16_8_;
        lVar131 = local_1f8 * local_238._16_8_;
        lVar138 = local_2a0 * (long)iVar152;
        lVar119 = lVar131 * 4;
        local_258 = (void *)(local_238._0_8_ + lVar131);
        local_260 = (void *)(local_238._0_8_ + lVar131 * 2);
        local_268 = (void *)(lVar131 * 3 + local_238._0_8_);
        local_3b0 = (void *)0x0;
        uVar135 = 0;
        do {
          uVar139 = 0;
          local_2c8 = 0;
          iStack_2c4 = 0;
          iStack_2c0 = 0;
          uStack_2bc = 0;
          local_2d8 = (Allocator *)0x0;
          iStack_2d0 = 0;
          iStack_2cc = 0;
          local_2e8 = 0;
          iStack_2e0 = 0;
          uStack_2dc = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          aiStack_2f0[0] = 0;
          aiStack_2f0[1] = 0;
          local_108 = (undefined1  [16])0x0;
          local_118 = (undefined1  [16])0x0;
          local_128 = (undefined1  [16])0x0;
          _d2 = (undefined1  [16])0x0;
          local_c8 = (undefined1  [16])0x0;
          local_d8 = (undefined1  [16])0x0;
          local_e8 = (undefined1  [16])0x0;
          _d3 = (undefined1  [16])0x0;
          sum3[0xc] = 0;
          sum3[0xd] = 0;
          sum3[0xe] = 0;
          sum3[0xf] = 0;
          sum3[8] = 0;
          sum3[9] = 0;
          sum3[10] = 0;
          sum3[0xb] = 0;
          sum3[4] = 0;
          sum3[5] = 0;
          sum3[6] = 0;
          sum3[7] = 0;
          sum3[0] = 0;
          sum3[1] = 0;
          sum3[2] = 0;
          sum3[3] = 0;
          if (3 < (int)_c) {
            lVar127 = (long)(int)local_238._44_4_ * (long)local_3b0;
            pvVar148 = (void *)(local_238._0_8_ + lVar127);
            pvVar143 = (void *)((long)local_258 + lVar127);
            pvVar145 = (void *)((long)local_260 + lVar127);
            pvVar128 = (void *)(lVar127 + (long)local_268);
            uVar151 = 0;
            pvVar133 = local_380;
            do {
              lVar127 = 0;
              do {
                uVar139 = *(ulong *)((long)pvVar148 + lVar127);
                uVar165 = (undefined2)(uVar139 >> 0x30);
                auVar155._8_4_ = 0;
                auVar155._0_8_ = uVar139;
                auVar155._12_2_ = uVar165;
                auVar155._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar139 >> 0x20);
                auVar244._12_4_ = auVar155._12_4_;
                auVar244._8_2_ = 0;
                auVar244._0_8_ = uVar139;
                auVar244._10_2_ = uVar165;
                auVar154._10_6_ = auVar244._10_6_;
                auVar154._8_2_ = uVar165;
                auVar154._0_8_ = uVar139;
                uVar165 = (undefined2)(uVar139 >> 0x10);
                auVar82._4_8_ = auVar154._8_8_;
                auVar82._2_2_ = uVar165;
                auVar82._0_2_ = uVar165;
                auVar156._0_4_ = (int)(short)uVar139;
                auVar156._4_4_ = auVar82._0_4_ >> 0x10;
                auVar156._8_4_ = auVar154._8_4_ >> 0x10;
                auVar156._12_4_ = auVar244._12_4_ >> 0x10;
                uVar139 = *(ulong *)((long)pvVar133 + lVar127);
                auVar7._8_4_ = 0;
                auVar7._0_8_ = uVar139;
                auVar7._12_2_ = (short)(uVar139 >> 0x30);
                auVar30._8_2_ = (short)(uVar139 >> 0x20);
                auVar30._0_8_ = uVar139;
                auVar30._10_4_ = auVar7._10_4_;
                auVar83._6_8_ = 0;
                auVar83._0_6_ = auVar30._8_6_;
                auVar66._4_2_ = (short)(uVar139 >> 0x10);
                auVar66._0_4_ = (uint)uVar139;
                auVar66._6_8_ = SUB148(auVar83 << 0x40,6);
                auVar243._0_4_ = (uint)uVar139 & 0xffff;
                auVar243._4_10_ = auVar66._4_10_;
                auVar243._14_2_ = 0;
                auVar244 = pmaddwd(auVar243,auVar156);
                iVar153 = *(int *)((long)aiStack_2f0 + lVar127 * 2);
                iVar126 = *(int *)((long)aiStack_2f0 + lVar127 * 2 + 4);
                uVar139 = *(ulong *)((long)pvVar143 + lVar127);
                uVar165 = (undefined2)(uVar139 >> 0x30);
                auVar174._8_4_ = 0;
                auVar174._0_8_ = uVar139;
                auVar174._12_2_ = uVar165;
                auVar174._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar139 >> 0x20);
                auVar173._12_4_ = auVar174._12_4_;
                auVar173._8_2_ = 0;
                auVar173._0_8_ = uVar139;
                auVar173._10_2_ = uVar165;
                auVar172._10_6_ = auVar173._10_6_;
                auVar172._8_2_ = uVar165;
                auVar172._0_8_ = uVar139;
                uVar165 = (undefined2)(uVar139 >> 0x10);
                auVar84._4_8_ = auVar172._8_8_;
                auVar84._2_2_ = uVar165;
                auVar84._0_2_ = uVar165;
                auVar175._0_4_ = (int)(short)uVar139;
                auVar175._4_4_ = auVar84._0_4_ >> 0x10;
                auVar175._8_4_ = auVar172._8_4_ >> 0x10;
                auVar175._12_4_ = auVar173._12_4_ >> 0x10;
                uVar139 = *(ulong *)((long)pvVar133 + lVar127 + 0x20);
                auVar8._8_4_ = 0;
                auVar8._0_8_ = uVar139;
                auVar8._12_2_ = (short)(uVar139 >> 0x30);
                auVar31._8_2_ = (short)(uVar139 >> 0x20);
                auVar31._0_8_ = uVar139;
                auVar31._10_4_ = auVar8._10_4_;
                auVar85._6_8_ = 0;
                auVar85._0_6_ = auVar31._8_6_;
                auVar67._4_2_ = (short)(uVar139 >> 0x10);
                auVar67._0_4_ = (uint)uVar139;
                auVar67._6_8_ = SUB148(auVar85 << 0x40,6);
                auVar225._0_4_ = (uint)uVar139 & 0xffff;
                auVar225._4_10_ = auVar67._4_10_;
                auVar225._14_2_ = 0;
                auVar170 = pmaddwd(auVar225,auVar175);
                uVar139 = *(ulong *)((long)pvVar145 + lVar127);
                uVar165 = (undefined2)(uVar139 >> 0x30);
                auVar208._8_4_ = 0;
                auVar208._0_8_ = uVar139;
                auVar208._12_2_ = uVar165;
                auVar208._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar139 >> 0x20);
                auVar207._12_4_ = auVar208._12_4_;
                auVar207._8_2_ = 0;
                auVar207._0_8_ = uVar139;
                auVar207._10_2_ = uVar165;
                auVar206._10_6_ = auVar207._10_6_;
                auVar206._8_2_ = uVar165;
                auVar206._0_8_ = uVar139;
                uVar165 = (undefined2)(uVar139 >> 0x10);
                auVar86._4_8_ = auVar206._8_8_;
                auVar86._2_2_ = uVar165;
                auVar86._0_2_ = uVar165;
                auVar209._0_4_ = (int)(short)uVar139;
                auVar209._4_4_ = auVar86._0_4_ >> 0x10;
                auVar209._8_4_ = auVar206._8_4_ >> 0x10;
                auVar209._12_4_ = auVar207._12_4_ >> 0x10;
                uVar139 = *(ulong *)((long)pvVar133 + lVar127 + 0x40);
                auVar9._8_4_ = 0;
                auVar9._0_8_ = uVar139;
                auVar9._12_2_ = (short)(uVar139 >> 0x30);
                auVar32._8_2_ = (short)(uVar139 >> 0x20);
                auVar32._0_8_ = uVar139;
                auVar32._10_4_ = auVar9._10_4_;
                auVar87._6_8_ = 0;
                auVar87._0_6_ = auVar32._8_6_;
                auVar261._6_8_ = SUB148(auVar87 << 0x40,6);
                auVar261._4_2_ = (short)(uVar139 >> 0x10);
                auVar261._0_2_ = (ushort)uVar139;
                auVar261._2_2_ = 0;
                auVar261._14_2_ = 0;
                auVar200 = pmaddwd(auVar261,auVar209);
                uVar139 = *(ulong *)((long)pvVar128 + lVar127);
                uVar165 = (undefined2)(uVar139 >> 0x30);
                auVar228._8_4_ = 0;
                auVar228._0_8_ = uVar139;
                auVar228._12_2_ = uVar165;
                auVar228._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar139 >> 0x20);
                auVar227._12_4_ = auVar228._12_4_;
                auVar227._8_2_ = 0;
                auVar227._0_8_ = uVar139;
                auVar227._10_2_ = uVar165;
                auVar226._10_6_ = auVar227._10_6_;
                auVar226._8_2_ = uVar165;
                auVar226._0_8_ = uVar139;
                uVar165 = (undefined2)(uVar139 >> 0x10);
                auVar88._4_8_ = auVar226._8_8_;
                auVar88._2_2_ = uVar165;
                auVar88._0_2_ = uVar165;
                auVar229._0_4_ = (int)(short)uVar139;
                auVar229._4_4_ = auVar88._0_4_ >> 0x10;
                auVar229._8_4_ = auVar226._8_4_ >> 0x10;
                auVar229._12_4_ = auVar227._12_4_ >> 0x10;
                uVar139 = *(ulong *)((long)pvVar133 + lVar127 + 0x60);
                auVar10._8_4_ = 0;
                auVar10._0_8_ = uVar139;
                auVar10._12_2_ = (short)(uVar139 >> 0x30);
                auVar33._8_2_ = (short)(uVar139 >> 0x20);
                auVar33._0_8_ = uVar139;
                auVar33._10_4_ = auVar10._10_4_;
                auVar89._6_8_ = 0;
                auVar89._0_6_ = auVar33._8_6_;
                auVar269._6_8_ = SUB148(auVar89 << 0x40,6);
                auVar269._4_2_ = (short)(uVar139 >> 0x10);
                auVar269._0_2_ = (ushort)uVar139;
                auVar269._2_2_ = 0;
                auVar269._14_2_ = 0;
                auVar224 = pmaddwd(auVar269,auVar229);
                *(int *)(d1 + lVar127) =
                     auVar224._0_4_ + auVar200._0_4_ + auVar170._0_4_ +
                     auVar244._0_4_ + *(int *)(d1 + lVar127);
                *(int *)(d1 + lVar127 + 2) =
                     auVar224._4_4_ + auVar200._4_4_ + auVar170._4_4_ +
                     auVar244._4_4_ + *(int *)(d1 + lVar127 + 2);
                *(int *)((long)aiStack_2f0 + lVar127 * 2) =
                     auVar224._8_4_ + auVar200._8_4_ + auVar170._8_4_ + auVar244._8_4_ + iVar153;
                *(int *)((long)aiStack_2f0 + lVar127 * 2 + 4) =
                     auVar224._12_4_ + auVar200._12_4_ + auVar170._12_4_ + auVar244._12_4_ + iVar126
                ;
                lVar141 = lVar130 + lVar127;
                uVar139 = *(ulong *)((long)pvVar133 + lVar130 + lVar127);
                auVar11._8_4_ = 0;
                auVar11._0_8_ = uVar139;
                auVar11._12_2_ = (short)(uVar139 >> 0x30);
                auVar34._8_2_ = (short)(uVar139 >> 0x20);
                auVar34._0_8_ = uVar139;
                auVar34._10_4_ = auVar11._10_4_;
                auVar90._6_8_ = 0;
                auVar90._0_6_ = auVar34._8_6_;
                auVar245._6_8_ = SUB148(auVar90 << 0x40,6);
                auVar245._4_2_ = (short)(uVar139 >> 0x10);
                auVar245._0_2_ = (ushort)uVar139;
                auVar245._2_2_ = 0;
                auVar245._14_2_ = 0;
                auVar170 = pmaddwd(auVar245,auVar156);
                iVar153 = *(int *)((long)aiStack_130 + lVar127 * 2);
                iVar126 = *(int *)(local_128 + lVar127 * 2 + -4);
                uVar139 = *(ulong *)((long)pvVar133 + lVar130 + 0x20 + lVar127);
                auVar12._8_4_ = 0;
                auVar12._0_8_ = uVar139;
                auVar12._12_2_ = (short)(uVar139 >> 0x30);
                auVar35._8_2_ = (short)(uVar139 >> 0x20);
                auVar35._0_8_ = uVar139;
                auVar35._10_4_ = auVar12._10_4_;
                auVar91._6_8_ = 0;
                auVar91._0_6_ = auVar35._8_6_;
                auVar262._6_8_ = SUB148(auVar91 << 0x40,6);
                auVar262._4_2_ = (short)(uVar139 >> 0x10);
                auVar262._0_2_ = (ushort)uVar139;
                auVar262._2_2_ = 0;
                auVar262._14_2_ = 0;
                auVar244 = pmaddwd(auVar262,auVar175);
                uVar139 = *(ulong *)((long)pvVar133 + lVar130 + 0x40 + lVar127);
                auVar13._8_4_ = 0;
                auVar13._0_8_ = uVar139;
                auVar13._12_2_ = (short)(uVar139 >> 0x30);
                auVar36._8_2_ = (short)(uVar139 >> 0x20);
                auVar36._0_8_ = uVar139;
                auVar36._10_4_ = auVar13._10_4_;
                auVar92._6_8_ = 0;
                auVar92._0_6_ = auVar36._8_6_;
                auVar270._6_8_ = SUB148(auVar92 << 0x40,6);
                auVar270._4_2_ = (short)(uVar139 >> 0x10);
                auVar270._0_2_ = (ushort)uVar139;
                auVar270._2_2_ = 0;
                auVar270._14_2_ = 0;
                auVar224 = pmaddwd(auVar270,auVar209);
                uVar139 = *(ulong *)((long)pvVar133 + lVar130 + 0x60 + lVar127);
                auVar14._8_4_ = 0;
                auVar14._0_8_ = uVar139;
                auVar14._12_2_ = (short)(uVar139 >> 0x30);
                auVar37._8_2_ = (short)(uVar139 >> 0x20);
                auVar37._0_8_ = uVar139;
                auVar37._10_4_ = auVar14._10_4_;
                auVar93._6_8_ = 0;
                auVar93._0_6_ = auVar37._8_6_;
                auVar263._6_8_ = SUB148(auVar93 << 0x40,6);
                auVar263._4_2_ = (short)(uVar139 >> 0x10);
                auVar263._0_2_ = (ushort)uVar139;
                auVar263._2_2_ = 0;
                auVar263._14_2_ = 0;
                auVar200 = pmaddwd(auVar263,auVar229);
                *(int *)(d2 + lVar127) =
                     auVar200._0_4_ + auVar224._0_4_ + auVar244._0_4_ +
                     auVar170._0_4_ + *(int *)(d2 + lVar127);
                *(int *)(d2 + lVar127 + 2) =
                     auVar200._4_4_ + auVar224._4_4_ + auVar244._4_4_ +
                     auVar170._4_4_ + *(int *)(d2 + lVar127 + 2);
                *(int *)((long)aiStack_130 + lVar127 * 2) =
                     auVar200._8_4_ + auVar224._8_4_ + auVar244._8_4_ + auVar170._8_4_ + iVar153;
                *(int *)(local_128 + lVar127 * 2 + -4) =
                     auVar200._12_4_ + auVar224._12_4_ + auVar244._12_4_ + auVar170._12_4_ + iVar126
                ;
                lVar146 = lVar130 + lVar141;
                uVar139 = *(ulong *)((long)pvVar133 + lVar130 + lVar141);
                auVar15._8_4_ = 0;
                auVar15._0_8_ = uVar139;
                auVar15._12_2_ = (short)(uVar139 >> 0x30);
                auVar38._8_2_ = (short)(uVar139 >> 0x20);
                auVar38._0_8_ = uVar139;
                auVar38._10_4_ = auVar15._10_4_;
                auVar94._6_8_ = 0;
                auVar94._0_6_ = auVar38._8_6_;
                auVar246._6_8_ = SUB148(auVar94 << 0x40,6);
                auVar246._4_2_ = (short)(uVar139 >> 0x10);
                auVar246._0_2_ = (ushort)uVar139;
                auVar246._2_2_ = 0;
                auVar246._14_2_ = 0;
                auVar170 = pmaddwd(auVar246,auVar156);
                iVar153 = *(int *)((long)aiStack_f0 + lVar127 * 2);
                iVar126 = *(int *)(local_e8 + lVar127 * 2 + -4);
                uVar139 = *(ulong *)((long)pvVar133 + lVar130 + 0x20 + lVar141);
                auVar16._8_4_ = 0;
                auVar16._0_8_ = uVar139;
                auVar16._12_2_ = (short)(uVar139 >> 0x30);
                auVar39._8_2_ = (short)(uVar139 >> 0x20);
                auVar39._0_8_ = uVar139;
                auVar39._10_4_ = auVar16._10_4_;
                auVar95._6_8_ = 0;
                auVar95._0_6_ = auVar39._8_6_;
                auVar264._6_8_ = SUB148(auVar95 << 0x40,6);
                auVar264._4_2_ = (short)(uVar139 >> 0x10);
                auVar264._0_2_ = (ushort)uVar139;
                auVar264._2_2_ = 0;
                auVar264._14_2_ = 0;
                auVar244 = pmaddwd(auVar264,auVar175);
                uVar139 = *(ulong *)((long)pvVar133 + lVar130 + 0x40 + lVar141);
                auVar17._8_4_ = 0;
                auVar17._0_8_ = uVar139;
                auVar17._12_2_ = (short)(uVar139 >> 0x30);
                auVar40._8_2_ = (short)(uVar139 >> 0x20);
                auVar40._0_8_ = uVar139;
                auVar40._10_4_ = auVar17._10_4_;
                auVar96._6_8_ = 0;
                auVar96._0_6_ = auVar40._8_6_;
                auVar271._6_8_ = SUB148(auVar96 << 0x40,6);
                auVar271._4_2_ = (short)(uVar139 >> 0x10);
                auVar271._0_2_ = (ushort)uVar139;
                auVar271._2_2_ = 0;
                auVar271._14_2_ = 0;
                auVar224 = pmaddwd(auVar271,auVar209);
                uVar139 = *(ulong *)((long)pvVar133 + lVar130 + 0x60 + lVar141);
                auVar18._8_4_ = 0;
                auVar18._0_8_ = uVar139;
                auVar18._12_2_ = (short)(uVar139 >> 0x30);
                auVar41._8_2_ = (short)(uVar139 >> 0x20);
                auVar41._0_8_ = uVar139;
                auVar41._10_4_ = auVar18._10_4_;
                auVar97._6_8_ = 0;
                auVar97._0_6_ = auVar41._8_6_;
                auVar265._6_8_ = SUB148(auVar97 << 0x40,6);
                auVar265._4_2_ = (short)(uVar139 >> 0x10);
                auVar265._0_2_ = (ushort)uVar139;
                auVar265._2_2_ = 0;
                auVar265._14_2_ = 0;
                auVar200 = pmaddwd(auVar265,auVar229);
                *(int *)(d3 + lVar127) =
                     auVar200._0_4_ + auVar224._0_4_ + auVar244._0_4_ +
                     auVar170._0_4_ + *(int *)(d3 + lVar127);
                *(int *)(d3 + lVar127 + 2) =
                     auVar200._4_4_ + auVar224._4_4_ + auVar244._4_4_ +
                     auVar170._4_4_ + *(int *)(d3 + lVar127 + 2);
                *(int *)((long)aiStack_f0 + lVar127 * 2) =
                     auVar200._8_4_ + auVar224._8_4_ + auVar244._8_4_ + auVar170._8_4_ + iVar153;
                *(int *)(local_e8 + lVar127 * 2 + -4) =
                     auVar200._12_4_ + auVar224._12_4_ + auVar244._12_4_ + auVar170._12_4_ + iVar126
                ;
                uVar139 = *(ulong *)((long)pvVar133 + lVar130 + lVar146);
                auVar19._8_4_ = 0;
                auVar19._0_8_ = uVar139;
                auVar19._12_2_ = (short)(uVar139 >> 0x30);
                auVar42._8_2_ = (short)(uVar139 >> 0x20);
                auVar42._0_8_ = uVar139;
                auVar42._10_4_ = auVar19._10_4_;
                auVar98._6_8_ = 0;
                auVar98._0_6_ = auVar42._8_6_;
                auVar247._6_8_ = SUB148(auVar98 << 0x40,6);
                auVar247._4_2_ = (short)(uVar139 >> 0x10);
                auVar247._0_2_ = (ushort)uVar139;
                auVar247._2_2_ = 0;
                auVar247._14_2_ = 0;
                auVar224 = pmaddwd(auVar247,auVar156);
                lVar141 = lVar127 * 2;
                iVar153 = *(int *)((long)sum3 + lVar141 + 4);
                iVar126 = *(int *)((long)sum3 + lVar141 + 8);
                iVar166 = *(int *)((long)sum3 + lVar141 + 0xc);
                uVar139 = *(ulong *)((long)pvVar133 + lVar130 + 0x20 + lVar146);
                auVar20._8_4_ = 0;
                auVar20._0_8_ = uVar139;
                auVar20._12_2_ = (short)(uVar139 >> 0x30);
                auVar43._8_2_ = (short)(uVar139 >> 0x20);
                auVar43._0_8_ = uVar139;
                auVar43._10_4_ = auVar20._10_4_;
                auVar99._6_8_ = 0;
                auVar99._0_6_ = auVar43._8_6_;
                auVar157._6_8_ = SUB148(auVar99 << 0x40,6);
                auVar157._4_2_ = (short)(uVar139 >> 0x10);
                auVar157._0_2_ = (ushort)uVar139;
                auVar157._2_2_ = 0;
                auVar157._14_2_ = 0;
                auVar170 = pmaddwd(auVar157,auVar175);
                uVar139 = *(ulong *)((long)pvVar133 + lVar130 + 0x40 + lVar146);
                auVar21._8_4_ = 0;
                auVar21._0_8_ = uVar139;
                auVar21._12_2_ = (short)(uVar139 >> 0x30);
                auVar44._8_2_ = (short)(uVar139 >> 0x20);
                auVar44._0_8_ = uVar139;
                auVar44._10_4_ = auVar21._10_4_;
                auVar100._6_8_ = 0;
                auVar100._0_6_ = auVar44._8_6_;
                auVar176._6_8_ = SUB148(auVar100 << 0x40,6);
                auVar176._4_2_ = (short)(uVar139 >> 0x10);
                auVar176._0_2_ = (ushort)uVar139;
                auVar176._2_2_ = 0;
                auVar176._14_2_ = 0;
                auVar200 = pmaddwd(auVar176,auVar209);
                uVar139 = *(ulong *)((long)pvVar133 + lVar130 + 0x60 + lVar146);
                auVar22._8_4_ = 0;
                auVar22._0_8_ = uVar139;
                auVar22._12_2_ = (short)(uVar139 >> 0x30);
                auVar45._8_2_ = (short)(uVar139 >> 0x20);
                auVar45._0_8_ = uVar139;
                auVar45._10_4_ = auVar22._10_4_;
                auVar101._6_8_ = 0;
                auVar101._0_6_ = auVar45._8_6_;
                auVar158._6_8_ = SUB148(auVar101 << 0x40,6);
                auVar158._4_2_ = (short)(uVar139 >> 0x10);
                auVar158._0_2_ = (ushort)uVar139;
                auVar158._2_2_ = 0;
                auVar158._14_2_ = 0;
                auVar244 = pmaddwd(auVar158,auVar229);
                lVar146 = lVar127 * 2;
                *(int *)((long)sum3 + lVar146) =
                     auVar244._0_4_ + auVar200._0_4_ + auVar170._0_4_ +
                     auVar224._0_4_ + *(int *)((long)sum3 + lVar141);
                *(int *)((long)sum3 + lVar146 + 4) =
                     auVar244._4_4_ + auVar200._4_4_ + auVar170._4_4_ + auVar224._4_4_ + iVar153;
                *(int *)((long)sum3 + lVar146 + 8) =
                     auVar244._8_4_ + auVar200._8_4_ + auVar170._8_4_ + auVar224._8_4_ + iVar126;
                *(int *)((long)sum3 + lVar146 + 0xc) =
                     auVar244._12_4_ + auVar200._12_4_ + auVar170._12_4_ + auVar224._12_4_ + iVar166
                ;
                lVar127 = lVar127 + 8;
              } while (lVar127 != 0x20);
              uVar139 = uVar151 + 4;
              lVar127 = uVar151 + 7;
              pvVar148 = (void *)((long)pvVar148 + lVar119);
              pvVar133 = (void *)((long)pvVar133 + iVar152 * local_2a8);
              pvVar143 = (void *)((long)pvVar143 + lVar119);
              pvVar145 = (void *)((long)pvVar145 + lVar119);
              pvVar128 = (void *)((long)pvVar128 + lVar119);
              uVar151 = uVar139;
            } while (lVar127 < (int)_c);
          }
          if ((int)uVar139 < (int)_c) {
            uVar139 = uVar139 & 0xffffffff;
            lVar127 = local_238._0_8_ +
                      (long)(int)local_238._44_4_ * (long)local_3b0 + lVar131 * uVar139;
            lVar141 = lVar138 * uVar139;
            pvVar148 = (void *)((long)local_380 + lVar141);
            pvVar143 = (void *)((long)local_310 + lVar141);
            pvVar145 = (void *)((long)local_318 + lVar141);
            pvVar133 = (void *)(lVar141 + (long)local_320);
            do {
              lVar141 = 0;
              do {
                uVar151 = *(ulong *)(lVar127 + lVar141);
                uVar165 = (undefined2)(uVar151 >> 0x30);
                auVar161._8_4_ = 0;
                auVar161._0_8_ = uVar151;
                auVar161._12_2_ = uVar165;
                auVar161._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar151 >> 0x20);
                auVar160._12_4_ = auVar161._12_4_;
                auVar160._8_2_ = 0;
                auVar160._0_8_ = uVar151;
                auVar160._10_2_ = uVar165;
                auVar159._10_6_ = auVar160._10_6_;
                auVar159._8_2_ = uVar165;
                auVar159._0_8_ = uVar151;
                uVar165 = (undefined2)(uVar151 >> 0x10);
                auVar102._4_8_ = auVar159._8_8_;
                auVar102._2_2_ = uVar165;
                auVar102._0_2_ = uVar165;
                auVar162._0_4_ = (int)(short)uVar151;
                auVar162._4_4_ = auVar102._0_4_ >> 0x10;
                auVar162._8_4_ = auVar159._8_4_ >> 0x10;
                auVar162._12_4_ = auVar160._12_4_ >> 0x10;
                uVar151 = *(ulong *)((long)pvVar148 + lVar141);
                auVar23._8_4_ = 0;
                auVar23._0_8_ = uVar151;
                auVar23._12_2_ = (short)(uVar151 >> 0x30);
                auVar46._8_2_ = (short)(uVar151 >> 0x20);
                auVar46._0_8_ = uVar151;
                auVar46._10_4_ = auVar23._10_4_;
                auVar103._6_8_ = 0;
                auVar103._0_6_ = auVar46._8_6_;
                auVar177._6_8_ = SUB148(auVar103 << 0x40,6);
                auVar177._4_2_ = (short)(uVar151 >> 0x10);
                auVar177._0_2_ = (ushort)uVar151;
                auVar177._2_2_ = 0;
                auVar177._14_2_ = 0;
                auVar170 = pmaddwd(auVar177,auVar162);
                iVar153 = *(int *)((long)aiStack_2f0 + lVar141 * 2);
                iVar126 = *(int *)((long)aiStack_2f0 + lVar141 * 2 + 4);
                *(int *)(d1 + lVar141) = auVar170._0_4_ + *(int *)(d1 + lVar141);
                *(int *)(d1 + lVar141 + 2) = auVar170._4_4_ + *(int *)(d1 + lVar141 + 2);
                *(int *)((long)aiStack_2f0 + lVar141 * 2) = auVar170._8_4_ + iVar153;
                *(int *)((long)aiStack_2f0 + lVar141 * 2 + 4) = auVar170._12_4_ + iVar126;
                uVar151 = *(ulong *)((long)pvVar143 + lVar141);
                auVar24._8_4_ = 0;
                auVar24._0_8_ = uVar151;
                auVar24._12_2_ = (short)(uVar151 >> 0x30);
                auVar47._8_2_ = (short)(uVar151 >> 0x20);
                auVar47._0_8_ = uVar151;
                auVar47._10_4_ = auVar24._10_4_;
                auVar104._6_8_ = 0;
                auVar104._0_6_ = auVar47._8_6_;
                auVar178._6_8_ = SUB148(auVar104 << 0x40,6);
                auVar178._4_2_ = (short)(uVar151 >> 0x10);
                auVar178._0_2_ = (ushort)uVar151;
                auVar178._2_2_ = 0;
                auVar178._14_2_ = 0;
                auVar170 = pmaddwd(auVar178,auVar162);
                iVar153 = *(int *)((long)aiStack_130 + lVar141 * 2);
                iVar126 = *(int *)(local_128 + lVar141 * 2 + -4);
                *(int *)(d2 + lVar141) = auVar170._0_4_ + *(int *)(d2 + lVar141);
                *(int *)(d2 + lVar141 + 2) = auVar170._4_4_ + *(int *)(d2 + lVar141 + 2);
                *(int *)((long)aiStack_130 + lVar141 * 2) = auVar170._8_4_ + iVar153;
                *(int *)(local_128 + lVar141 * 2 + -4) = auVar170._12_4_ + iVar126;
                uVar151 = *(ulong *)((long)pvVar145 + lVar141);
                auVar25._8_4_ = 0;
                auVar25._0_8_ = uVar151;
                auVar25._12_2_ = (short)(uVar151 >> 0x30);
                auVar48._8_2_ = (short)(uVar151 >> 0x20);
                auVar48._0_8_ = uVar151;
                auVar48._10_4_ = auVar25._10_4_;
                auVar105._6_8_ = 0;
                auVar105._0_6_ = auVar48._8_6_;
                auVar179._6_8_ = SUB148(auVar105 << 0x40,6);
                auVar179._4_2_ = (short)(uVar151 >> 0x10);
                auVar179._0_2_ = (ushort)uVar151;
                auVar179._2_2_ = 0;
                auVar179._14_2_ = 0;
                auVar170 = pmaddwd(auVar179,auVar162);
                iVar153 = *(int *)((long)aiStack_f0 + lVar141 * 2);
                iVar126 = *(int *)(local_e8 + lVar141 * 2 + -4);
                *(int *)(d3 + lVar141) = auVar170._0_4_ + *(int *)(d3 + lVar141);
                *(int *)(d3 + lVar141 + 2) = auVar170._4_4_ + *(int *)(d3 + lVar141 + 2);
                *(int *)((long)aiStack_f0 + lVar141 * 2) = auVar170._8_4_ + iVar153;
                *(int *)(local_e8 + lVar141 * 2 + -4) = auVar170._12_4_ + iVar126;
                uVar151 = *(ulong *)((long)pvVar133 + lVar141);
                auVar26._8_4_ = 0;
                auVar26._0_8_ = uVar151;
                auVar26._12_2_ = (short)(uVar151 >> 0x30);
                auVar49._8_2_ = (short)(uVar151 >> 0x20);
                auVar49._0_8_ = uVar151;
                auVar49._10_4_ = auVar26._10_4_;
                auVar106._6_8_ = 0;
                auVar106._0_6_ = auVar49._8_6_;
                auVar180._6_8_ = SUB148(auVar106 << 0x40,6);
                auVar180._4_2_ = (short)(uVar151 >> 0x10);
                auVar180._0_2_ = (ushort)uVar151;
                auVar180._2_2_ = 0;
                auVar180._14_2_ = 0;
                auVar170 = pmaddwd(auVar180,auVar162);
                lVar146 = lVar141 * 2;
                iVar153 = *(int *)((long)sum3 + lVar146 + 4);
                iVar126 = *(int *)((long)sum3 + lVar146 + 8);
                iVar166 = *(int *)((long)sum3 + lVar146 + 0xc);
                lVar149 = lVar141 * 2;
                *(int *)((long)sum3 + lVar149) = auVar170._0_4_ + *(int *)((long)sum3 + lVar146);
                *(int *)((long)sum3 + lVar149 + 4) = auVar170._4_4_ + iVar153;
                *(int *)((long)sum3 + lVar149 + 8) = auVar170._8_4_ + iVar126;
                *(int *)((long)sum3 + lVar149 + 0xc) = auVar170._12_4_ + iVar166;
                lVar141 = lVar141 + 8;
              } while (lVar141 != 0x20);
              uVar139 = uVar139 + 1;
              lVar127 = lVar127 + lVar131;
              pvVar148 = (void *)((long)pvVar148 + lVar138);
              pvVar143 = (void *)((long)pvVar143 + lVar138);
              pvVar145 = (void *)((long)pvVar145 + lVar138);
              pvVar133 = (void *)((long)pvVar133 + lVar138);
            } while (uVar139 != uVar134);
          }
          lVar127 = 0;
          do {
            *(undefined4 *)((long)d0 + lVar127) = *(undefined4 *)((long)d1 + lVar127);
            *(undefined4 *)((long)d0 + lVar127) = *(undefined4 *)((long)d2 + lVar127);
            *(undefined4 *)((long)d0 + lVar127) = *(undefined4 *)((long)d3 + lVar127);
            *(undefined4 *)((long)d0 + lVar127) = *(undefined4 *)((long)sum3 + lVar127);
            lVar127 = lVar127 + 4;
          } while (lVar127 != 0x40);
          uVar135 = uVar135 + 1;
          local_3b0 = (void *)((long)local_3b0 + local_238._16_8_);
        } while (uVar135 != uVar136);
      }
      local_380 = (void *)((long)local_380 + local_288);
      local_310 = (void *)((long)local_310 + local_288);
      local_318 = (void *)((long)local_318 + local_288);
      local_320 = (void *)((long)local_320 + local_288);
      asVar120 = (short  [4])((long)local_270 + 1U);
      local_280 = asVar140;
    } while ((short  [4])((long)local_270 + 1U) != asVar140);
  }
  if ((int)local_2b0 != iVar129) {
    local_280[0] = d0[0];
    local_280[1] = d0[1];
    local_280[2] = d0[2];
    local_280[3] = d0[3];
    local_3a0 = kernel_tm->data;
    sVar3 = kernel_tm->elemsize;
    lVar130 = kernel_tm->cstep * sVar3;
    local_288 = 0;
    local_290 = 0;
    local_3b0 = (void *)(lVar130 * local_2b0 + (long)local_3a0);
    local_298 = sVar3 * 4;
    local_2a0 = sVar3 * 2;
    local_2a8 = sVar3 * 3;
    lVar119 = kernel_tm->cstep * local_2b0;
    uVar135 = local_2b0;
    do {
      if (0 < (int)uVar136) {
        lVar127 = (long)kernel_tm->w;
        lVar141 = local_1f8 * local_238._16_8_;
        lVar131 = lVar141 * 4;
        lVar138 = local_298 * lVar127;
        local_258 = (void *)(local_238._0_8_ + lVar141 * 2);
        local_260 = (void *)(local_2a0 * lVar127 + (long)local_3b0);
        local_268 = (void *)(lVar141 * 3 + local_238._0_8_);
        local_270 = (short  [4])(local_2a8 * lVar127 + (long)local_3b0);
        lVar146 = 0;
        uVar139 = 0;
        local_250 = (void *)local_238._0_8_;
        do {
          uVar151 = 0;
          local_2c8 = 0;
          iStack_2c4 = 0;
          iStack_2c0 = 0;
          uStack_2bc = 0;
          local_2d8 = (Allocator *)0x0;
          iStack_2d0 = 0;
          iStack_2cc = 0;
          local_2e8 = 0;
          iStack_2e0 = 0;
          uStack_2dc = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          aiStack_2f0[0] = 0;
          aiStack_2f0[1] = 0;
          if (3 < (int)_c) {
            lVar124 = (int)local_238._44_4_ * lVar146;
            pvVar148 = (void *)(local_238._0_8_ + lVar124);
            lVar149 = local_238._0_8_ + lVar124 + lVar141;
            pvVar143 = (void *)((long)local_258 + lVar124);
            pvVar125 = (void *)(lVar124 + (long)local_268);
            pvVar145 = local_3b0;
            uVar121 = 0;
            asVar140 = local_270;
            pvVar133 = (void *)((long)local_3b0 + sVar3 * lVar127);
            pvVar128 = local_260;
            do {
              lVar124 = 0;
              do {
                uVar151 = *(ulong *)((long)pvVar148 + lVar124);
                uVar1 = *(ulong *)((long)pvVar145 + lVar124);
                uVar165 = (undefined2)(uVar1 >> 0x30);
                auVar184._8_4_ = 0;
                auVar184._0_8_ = uVar1;
                auVar184._12_2_ = uVar165;
                auVar184._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar1 >> 0x20);
                auVar183._12_4_ = auVar184._12_4_;
                auVar183._8_2_ = 0;
                auVar183._0_8_ = uVar1;
                auVar183._10_2_ = uVar165;
                auVar182._10_6_ = auVar183._10_6_;
                auVar182._8_2_ = uVar165;
                auVar182._0_8_ = uVar1;
                uVar165 = (undefined2)(uVar1 >> 0x10);
                auVar181._8_8_ = auVar182._8_8_;
                auVar181._6_2_ = uVar165;
                auVar181._4_2_ = uVar165;
                auVar181._0_2_ = (undefined2)uVar1;
                auVar181._2_2_ = auVar181._0_2_;
                auVar50._8_4_ = 0;
                auVar50._0_8_ = uVar151;
                auVar50._12_2_ = (short)(uVar151 >> 0x30);
                auVar58._8_2_ = (short)(uVar151 >> 0x20);
                auVar58._0_8_ = uVar151;
                auVar58._10_4_ = auVar50._10_4_;
                auVar107._6_8_ = 0;
                auVar107._0_6_ = auVar58._8_6_;
                auVar71._4_2_ = (short)(uVar151 >> 0x10);
                auVar71._0_4_ = (uint)uVar151;
                auVar71._6_8_ = SUB148(auVar107 << 0x40,6);
                auVar163._0_4_ = (uint)uVar151 & 0xffff;
                auVar163._4_10_ = auVar71._4_10_;
                auVar163._14_2_ = 0;
                auVar170 = pmaddwd(auVar163,auVar181);
                iVar152 = *(int *)((long)aiStack_2f0 + lVar124 * 2);
                iVar153 = *(int *)((long)aiStack_2f0 + lVar124 * 2 + 4);
                uVar151 = *(ulong *)(lVar149 + lVar124);
                uVar1 = *(ulong *)((long)pvVar133 + lVar124);
                uVar165 = (undefined2)(uVar1 >> 0x30);
                auVar213._8_4_ = 0;
                auVar213._0_8_ = uVar1;
                auVar213._12_2_ = uVar165;
                auVar213._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar1 >> 0x20);
                auVar212._12_4_ = auVar213._12_4_;
                auVar212._8_2_ = 0;
                auVar212._0_8_ = uVar1;
                auVar212._10_2_ = uVar165;
                auVar211._10_6_ = auVar212._10_6_;
                auVar211._8_2_ = uVar165;
                auVar211._0_8_ = uVar1;
                uVar165 = (undefined2)(uVar1 >> 0x10);
                auVar210._8_8_ = auVar211._8_8_;
                auVar210._6_2_ = uVar165;
                auVar210._4_2_ = uVar165;
                auVar210._0_2_ = (undefined2)uVar1;
                auVar210._2_2_ = auVar210._0_2_;
                auVar51._8_4_ = 0;
                auVar51._0_8_ = uVar151;
                auVar51._12_2_ = (short)(uVar151 >> 0x30);
                auVar59._8_2_ = (short)(uVar151 >> 0x20);
                auVar59._0_8_ = uVar151;
                auVar59._10_4_ = auVar51._10_4_;
                auVar108._6_8_ = 0;
                auVar108._0_6_ = auVar59._8_6_;
                auVar72._4_2_ = (short)(uVar151 >> 0x10);
                auVar72._0_4_ = (uint)uVar151;
                auVar72._6_8_ = SUB148(auVar108 << 0x40,6);
                auVar185._0_4_ = (uint)uVar151 & 0xffff;
                auVar185._4_10_ = auVar72._4_10_;
                auVar185._14_2_ = 0;
                auVar244 = pmaddwd(auVar185,auVar210);
                uVar151 = *(ulong *)((long)pvVar143 + lVar124);
                uVar1 = *(ulong *)((long)pvVar128 + lVar124);
                uVar165 = (undefined2)(uVar1 >> 0x30);
                auVar233._8_4_ = 0;
                auVar233._0_8_ = uVar1;
                auVar233._12_2_ = uVar165;
                auVar233._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar1 >> 0x20);
                auVar232._12_4_ = auVar233._12_4_;
                auVar232._8_2_ = 0;
                auVar232._0_8_ = uVar1;
                auVar232._10_2_ = uVar165;
                auVar231._10_6_ = auVar232._10_6_;
                auVar231._8_2_ = uVar165;
                auVar231._0_8_ = uVar1;
                uVar165 = (undefined2)(uVar1 >> 0x10);
                auVar230._8_8_ = auVar231._8_8_;
                auVar230._6_2_ = uVar165;
                auVar230._4_2_ = uVar165;
                auVar230._0_2_ = (undefined2)uVar1;
                auVar230._2_2_ = auVar230._0_2_;
                auVar52._8_4_ = 0;
                auVar52._0_8_ = uVar151;
                auVar52._12_2_ = (short)(uVar151 >> 0x30);
                auVar60._8_2_ = (short)(uVar151 >> 0x20);
                auVar60._0_8_ = uVar151;
                auVar60._10_4_ = auVar52._10_4_;
                auVar109._6_8_ = 0;
                auVar109._0_6_ = auVar60._8_6_;
                auVar214._6_8_ = SUB148(auVar109 << 0x40,6);
                auVar214._4_2_ = (short)(uVar151 >> 0x10);
                auVar214._0_2_ = (ushort)uVar151;
                auVar214._2_2_ = 0;
                auVar214._14_2_ = 0;
                auVar224 = pmaddwd(auVar214,auVar230);
                uVar151 = *(ulong *)((long)pvVar125 + lVar124);
                uVar1 = *(ulong *)((long)asVar140 + lVar124);
                uVar165 = (undefined2)(uVar1 >> 0x30);
                auVar237._8_4_ = 0;
                auVar237._0_8_ = uVar1;
                auVar237._12_2_ = uVar165;
                auVar237._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar1 >> 0x20);
                auVar236._12_4_ = auVar237._12_4_;
                auVar236._8_2_ = 0;
                auVar236._0_8_ = uVar1;
                auVar236._10_2_ = uVar165;
                auVar235._10_6_ = auVar236._10_6_;
                auVar235._8_2_ = uVar165;
                auVar235._0_8_ = uVar1;
                uVar165 = (undefined2)(uVar1 >> 0x10);
                auVar234._8_8_ = auVar235._8_8_;
                auVar234._6_2_ = uVar165;
                auVar234._4_2_ = uVar165;
                auVar234._0_2_ = (undefined2)uVar1;
                auVar234._2_2_ = auVar234._0_2_;
                auVar53._8_4_ = 0;
                auVar53._0_8_ = uVar151;
                auVar53._12_2_ = (short)(uVar151 >> 0x30);
                auVar61._8_2_ = (short)(uVar151 >> 0x20);
                auVar61._0_8_ = uVar151;
                auVar61._10_4_ = auVar53._10_4_;
                auVar110._6_8_ = 0;
                auVar110._0_6_ = auVar61._8_6_;
                auVar186._6_8_ = SUB148(auVar110 << 0x40,6);
                auVar186._4_2_ = (short)(uVar151 >> 0x10);
                auVar186._0_2_ = (ushort)uVar151;
                auVar186._2_2_ = 0;
                auVar186._14_2_ = 0;
                auVar200 = pmaddwd(auVar186,auVar234);
                *(int *)(d1 + lVar124) =
                     auVar200._0_4_ + auVar224._0_4_ + auVar244._0_4_ +
                     auVar170._0_4_ + *(int *)(d1 + lVar124);
                *(int *)(d1 + lVar124 + 2) =
                     auVar200._4_4_ + auVar224._4_4_ + auVar244._4_4_ +
                     auVar170._4_4_ + *(int *)(d1 + lVar124 + 2);
                *(int *)((long)aiStack_2f0 + lVar124 * 2) =
                     auVar200._8_4_ + auVar224._8_4_ + auVar244._8_4_ + auVar170._8_4_ + iVar152;
                *(int *)((long)aiStack_2f0 + lVar124 * 2 + 4) =
                     auVar200._12_4_ + auVar224._12_4_ + auVar244._12_4_ + auVar170._12_4_ + iVar153
                ;
                lVar124 = lVar124 + 8;
              } while (lVar124 != 0x20);
              uVar151 = uVar121 + 4;
              lVar124 = uVar121 + 7;
              pvVar148 = (void *)((long)pvVar148 + lVar131);
              pvVar145 = (void *)((long)pvVar145 + lVar138);
              lVar149 = lVar149 + lVar131;
              pvVar133 = (void *)((long)pvVar133 + lVar138);
              pvVar143 = (void *)((long)pvVar143 + lVar131);
              pvVar128 = (void *)((long)pvVar128 + lVar138);
              pvVar125 = (void *)((long)pvVar125 + lVar131);
              asVar140 = (short  [4])((long)asVar140 + lVar138);
              uVar121 = uVar151;
            } while (lVar124 < (int)_c);
          }
          if ((int)uVar151 < (int)_c) {
            uVar151 = uVar151 & 0xffffffff;
            lVar149 = local_238._0_8_ + (int)local_238._44_4_ * lVar146 + lVar141 * uVar151;
            pvVar148 = (void *)((lVar127 * uVar151 + lVar119) * sVar3 + (long)local_3a0);
            do {
              lVar124 = 0;
              do {
                uVar121 = *(ulong *)(lVar149 + lVar124 * 2);
                uVar1 = *(ulong *)((long)pvVar148 + lVar124 * 2);
                uVar165 = (undefined2)(uVar1 >> 0x30);
                auVar190._8_4_ = 0;
                auVar190._0_8_ = uVar1;
                auVar190._12_2_ = uVar165;
                auVar190._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar1 >> 0x20);
                auVar189._12_4_ = auVar190._12_4_;
                auVar189._8_2_ = 0;
                auVar189._0_8_ = uVar1;
                auVar189._10_2_ = uVar165;
                auVar188._10_6_ = auVar189._10_6_;
                auVar188._8_2_ = uVar165;
                auVar188._0_8_ = uVar1;
                uVar165 = (undefined2)(uVar1 >> 0x10);
                auVar187._8_8_ = auVar188._8_8_;
                auVar187._6_2_ = uVar165;
                auVar187._4_2_ = uVar165;
                auVar187._0_2_ = (undefined2)uVar1;
                auVar187._2_2_ = auVar187._0_2_;
                auVar54._8_4_ = 0;
                auVar54._0_8_ = uVar121;
                auVar54._12_2_ = (short)(uVar121 >> 0x30);
                auVar62._8_2_ = (short)(uVar121 >> 0x20);
                auVar62._0_8_ = uVar121;
                auVar62._10_4_ = auVar54._10_4_;
                auVar111._6_8_ = 0;
                auVar111._0_6_ = auVar62._8_6_;
                auVar164._6_8_ = SUB148(auVar111 << 0x40,6);
                auVar164._4_2_ = (short)(uVar121 >> 0x10);
                auVar164._0_2_ = (ushort)uVar121;
                auVar164._2_2_ = 0;
                auVar164._14_2_ = 0;
                auVar170 = pmaddwd(auVar164,auVar187);
                iVar152 = *(int *)(d1 + lVar124 * 2 + 2);
                iVar153 = aiStack_2f0[lVar124];
                iVar126 = aiStack_2f0[lVar124 + 1];
                *(int *)(d1 + lVar124 * 2) = auVar170._0_4_ + *(int *)(d1 + lVar124 * 2);
                *(int *)(d1 + lVar124 * 2 + 2) = auVar170._4_4_ + iVar152;
                aiStack_2f0[lVar124] = auVar170._8_4_ + iVar153;
                aiStack_2f0[lVar124 + 1] = auVar170._12_4_ + iVar126;
                lVar124 = lVar124 + 4;
              } while (lVar124 != 0x10);
              uVar151 = uVar151 + 1;
              lVar149 = lVar149 + lVar141;
              pvVar148 = (void *)((long)pvVar148 + sVar3 * lVar127);
            } while (uVar151 != uVar134);
          }
          *(ulong *)((long)d0 + 0x30) = CONCAT44(iStack_2c4,local_2c8);
          *(ulong *)((long)d0 + 0x38) = CONCAT44(uStack_2bc,iStack_2c0);
          *(Allocator **)((long)d0 + 0x20) = local_2d8;
          *(ulong *)((long)d0 + 0x28) = CONCAT44(iStack_2cc,iStack_2d0);
          *(size_t *)((long)d0 + 0x10) = local_2e8;
          *(ulong *)((long)d0 + 0x18) = CONCAT44(uStack_2dc,iStack_2e0);
          *(short (*) [4])d0 = d1;
          *(ulong *)((long)d0 + 8) = CONCAT44(aiStack_2f0[1],aiStack_2f0[0]);
          uVar139 = uVar139 + 1;
          lVar146 = lVar146 + local_238._16_8_;
        } while (uVar139 != uVar136);
      }
      uVar135 = uVar135 + 1;
      local_3b0 = (void *)((long)local_3b0 + lVar130);
      local_3a0 = (void *)((long)local_3a0 + lVar130);
    } while ((long)uVar135 < (long)uVar117);
  }
  piVar2 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if ((Allocator *)local_238._32_8_ == (Allocator *)0x0) {
        if ((void *)local_238._0_8_ != (void *)0x0) {
          free((void *)local_238._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_238._32_8_)[3])();
      }
    }
  }
  local_1f8 = 0;
  local_238._0_8_ = (void *)0x0;
  local_238._8_4_ = 0;
  local_238._12_4_ = 0;
  local_238._16_8_ = 0;
  local_238._24_4_ = 0;
  local_238._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_238._32_8_ = (Allocator *)0x0;
  local_238._40_4_ = 0;
  local_238._44_4_ = 0;
  local_2b8 = 0;
  d1[0] = 0;
  d1[1] = 0;
  d1[2] = 0;
  d1[3] = 0;
  aiStack_2f0[0] = 0;
  aiStack_2f0[1] = 0;
  local_2e8 = 0;
  iStack_2e0 = 0;
  local_2d8 = (Allocator *)0x0;
  iStack_2d0 = 0;
  iStack_2cc = 0;
  local_2c8 = 0;
  iStack_2c4 = 0;
  iStack_2c0 = 0;
  Mat::create((Mat *)d1,(int)local_148,local_23c,iVar129,4,opt->workspace_allocator);
  if (0 < iVar129) {
    uVar134 = 1;
    if (1 < (int)uVar147) {
      uVar134 = (ulong)uVar147;
    }
    uVar135 = 1;
    if (1 < (int)uVar150) {
      uVar135 = (ulong)uVar150;
    }
    local_3b0 = (void *)0x0;
    do {
      if (0 < (int)local_278) {
        uVar139 = 0;
        do {
          if (0 < (int)local_248) {
            puVar122 = (undefined8 *)
                       (local_2b8 * local_2e8 * (long)local_3b0 + (long)d1 +
                       uVar139 * (long)iStack_2cc * local_2e8 * 2);
            uVar151 = uVar134;
            do {
              iVar152 = *(int *)((long)d0 + 4) + *(int *)((long)d0 + 0x14) +
                        *(int *)((long)d0 + 0x24);
              iVar126 = *(int *)((long)d0 + 8) + *(int *)((long)d0 + 0x18) +
                        *(int *)((long)d0 + 0x28);
              iVar153 = *(int *)((long)d0 + 0xc) + *(int *)((long)d0 + 0x1c) +
                        *(int *)((long)d0 + 0x2c);
              iVar166 = (*(int *)((long)d0 + 0x14) - *(int *)((long)d0 + 0x24)) +
                        *(int *)((long)d0 + 0x34);
              iVar167 = (*(int *)((long)d0 + 0x18) - *(int *)((long)d0 + 0x28)) +
                        *(int *)((long)d0 + 0x38);
              local_13c = (*(int *)((long)d0 + 0x1c) - *(int *)((long)d0 + 0x2c)) +
                          *(int *)((long)d0 + 0x3c);
              sum3[0] = iVar153;
              iVar129 = *(int *)d0 + *(int *)((long)d0 + 0x10) + *(int *)((long)d0 + 0x20) + iVar152
                        + iVar126;
              iVar153 = (iVar152 - iVar126) + iVar153;
              iVar152 = (*(int *)((long)d0 + 0x10) - *(int *)((long)d0 + 0x20)) +
                        *(int *)((long)d0 + 0x30) + iVar166 + iVar167;
              d2._4_4_ = iVar152;
              d2._0_4_ = iVar129;
              iVar126 = (iVar166 - iVar167) + local_13c;
              d3._4_4_ = iVar126;
              d3._0_4_ = iVar153;
              *puVar122 = CONCAT44(iVar152 >> 2,iVar129 >> 2);
              *(ulong *)((long)puVar122 + (long)iStack_2cc * local_2e8) =
                   CONCAT44(iVar126 >> 2,iVar153 >> 2);
              puVar122 = puVar122 + 1;
              uVar151 = uVar151 - 1;
            } while (uVar151 != 0);
          }
          uVar139 = uVar139 + 1;
        } while (uVar139 != uVar135);
      }
      local_3b0 = (void *)((long)local_3b0 + 1);
    } while (local_3b0 != (void *)uVar117);
  }
  copy_cut_border((Mat *)d1,local_150,0,local_2c8 - local_150->h,0,iStack_2cc - local_150->w,opt);
  piVar2 = (int *)CONCAT44(aiStack_2f0[1],aiStack_2f0[0]);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_2d8 == (Allocator *)0x0) {
        if (d1 != (short  [4])0x0) {
          free((void *)d1);
        }
      }
      else {
        (*local_2d8->_vptr_Allocator[3])();
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if ((Allocator *)local_238._32_8_ == (Allocator *)0x0) {
        if ((void *)local_238._0_8_ != (void *)0x0) {
          free((void *)local_238._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_238._32_8_)[3])();
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4 * 4, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 2;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[4], d1[4], d2[4], d3[4];
                    short w0[4], w1[4], w2[4], w3[4];
                    short t0[4], t1[4], t2[4], t3[4];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0] = w0[0];
                        t1[0] = w0[1];
                        t2[0] = w0[2];
                        t3[0] = w0[3];
                        t0[1] = w1[0];
                        t1[1] = w1[1];
                        t2[1] = w1[2];
                        t3[1] = w1[3];
                        t0[2] = w2[0];
                        t1[2] = w2[1];
                        t2[2] = w2[2];
                        t3[2] = w2[3];
                        t0[3] = w3[0];
                        t1[3] = w3[1];
                        t2[3] = w3[2];
                        t3[3] = w3[3];
                    }
                    // U = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n] = d0[n];
                        out_tm0[n + 4] = d1[n];
                        out_tm0[n + 8] = d2[n];
                        out_tm0[n + 12] = d3[n];
                    }

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p + 1);
            Mat out2_tm = top_blob_tm.channel(p + 2);
            Mat out3_tm = top_blob_tm.channel(p + 3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p + 1);
            const Mat kernel2_tm = kernel_tm.channel(p + 2);
            const Mat kernel3_tm = kernel_tm.channel(p + 3);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);
                int* output1_tm = out1_tm.row<int>(i);
                int* output2_tm = out2_tm.row<int>(i);
                int* output3_tm = out3_tm.row<int>(i);

                int sum0[16] = {0};
                int sum1[16] = {0};
                int sum2[16] = {0};
                int sum3[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += (int)r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += (int)r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += (int)r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum1[n] += (int)r0[n] * k1[n];
                        sum2[n] += (int)r0[n] * k2[n];
                        sum3[n] += (int)r0[n] * k3[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel0_tm.row<short>(q + 1);
                    const short* k2 = kernel0_tm.row<short>(q + 2);
                    const short* k3 = kernel0_tm.row<short>(q + 3);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum0[n] += (int)r1[n] * k1[n];
                        sum0[n] += (int)r2[n] * k2[n];
                        sum0[n] += (int)r3[n] * k3[n];
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // };

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j = 0; j < nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j * 2);
                int* outRow1 = out.row<int>(j * 2 + 1);

                for (int i = 0; i < nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j * nRowBlocks + i);

                    int s0[4], s1[4], s2[4], s3[4];
                    int w0[4], w1[4];
                    int d0[2], d1[2], d2[2], d3[2];
                    int o0[2], o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n + 4];
                        s2[n] = out_tile[n + 8];
                        s3[n] = out_tile[n + 12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0];
                        d0[1] = w1[0];
                        d1[0] = w0[1];
                        d1[1] = w1[1];
                        d2[0] = w0[2];
                        d2[1] = w1[2];
                        d3[0] = w0[3];
                        d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n];
                        o1[n] = d1[n] - d2[n] + d3[n];
                    }
                    // save to top blob tm,why right 2,because the G' = G*2
                    outRow0[0] = o0[0] >> 2;
                    outRow0[1] = o0[1] >> 2;
                    outRow1[0] = o1[0] >> 2;
                    outRow1[1] = o1[1] >> 2;

                    outRow0 += 2;
                    outRow1 += 2;
                }
            }
        }
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}